

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::EndFrame(void)

{
  bool bVar1;
  _func_void_ImGuiViewport_ptr_ImGuiPlatformImeData_ptr *p_Var2;
  ImGuiWindow *window_00;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [11];
  undefined1 auVar6 [12];
  undefined1 auVar7 [13];
  undefined1 auVar8 [14];
  ImGuiContext *ctx;
  bool bVar9;
  ImGuiWindow **ppIVar10;
  char cVar11;
  undefined1 extraout_XMM0_Ba;
  char cVar12;
  undefined1 extraout_XMM0_Bb;
  char cVar13;
  undefined1 extraout_XMM0_Bc;
  char cVar14;
  undefined1 extraout_XMM0_Bd;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  char cVar25;
  byte bVar26;
  byte local_42;
  byte local_41;
  ImGuiViewport *local_40;
  ImGuiWindow *window;
  int i;
  bool is_elapsed;
  bool is_delivered;
  ImGuiViewport *viewport;
  ImGuiContext *g;
  
  ctx = GImGui;
  if ((GImGui->Initialized & 1U) == 0) {
    __assert_fail("g.Initialized",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/imgui-src/imgui.cpp"
                  ,0x13b1,"void ImGui::EndFrame()");
  }
  if (GImGui->FrameCountEnded != GImGui->FrameCount) {
    if ((GImGui->WithinFrameScope & 1U) == 0) {
      __assert_fail("g.WithinFrameScope && \"Forgot to call ImGui::NewFrame()?\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/imgui-src/imgui.cpp"
                    ,0x13b6,"void ImGui::EndFrame()");
    }
    CallContextHooks(GImGui,ImGuiContextHookType_EndFramePre);
    ErrorCheckEndFrameSanityChecks();
    if ((ctx->IO).SetPlatformImeDataFn !=
        (_func_void_ImGuiViewport_ptr_ImGuiPlatformImeData_ptr *)0x0) {
      cVar11 = -((ctx->PlatformImeData).WantVisible == (ctx->PlatformImeDataPrev).WantVisible);
      cVar12 = -((ctx->PlatformImeData).field_0x1 == (ctx->PlatformImeDataPrev).field_0x1);
      cVar13 = -((ctx->PlatformImeData).field_0x2 == (ctx->PlatformImeDataPrev).field_0x2);
      cVar14 = -((ctx->PlatformImeData).field_0x3 == (ctx->PlatformImeDataPrev).field_0x3);
      cVar15 = -(*(char *)&(ctx->PlatformImeData).InputPos.x ==
                *(char *)&(ctx->PlatformImeDataPrev).InputPos.x);
      cVar16 = -(*(char *)((long)&(ctx->PlatformImeData).InputPos.x + 1) ==
                *(char *)((long)&(ctx->PlatformImeDataPrev).InputPos.x + 1));
      cVar17 = -(*(char *)((long)&(ctx->PlatformImeData).InputPos.x + 2) ==
                *(char *)((long)&(ctx->PlatformImeDataPrev).InputPos.x + 2));
      cVar18 = -(*(char *)((long)&(ctx->PlatformImeData).InputPos.x + 3) ==
                *(char *)((long)&(ctx->PlatformImeDataPrev).InputPos.x + 3));
      cVar19 = -(*(char *)&(ctx->PlatformImeData).InputPos.y ==
                *(char *)&(ctx->PlatformImeDataPrev).InputPos.y);
      cVar20 = -(*(char *)((long)&(ctx->PlatformImeData).InputPos.y + 1) ==
                *(char *)((long)&(ctx->PlatformImeDataPrev).InputPos.y + 1));
      cVar21 = -(*(char *)((long)&(ctx->PlatformImeData).InputPos.y + 2) ==
                *(char *)((long)&(ctx->PlatformImeDataPrev).InputPos.y + 2));
      cVar22 = -(*(char *)((long)&(ctx->PlatformImeData).InputPos.y + 3) ==
                *(char *)((long)&(ctx->PlatformImeDataPrev).InputPos.y + 3));
      cVar23 = -(*(char *)&(ctx->PlatformImeData).InputLineHeight ==
                *(char *)&(ctx->PlatformImeDataPrev).InputLineHeight);
      cVar24 = -(*(char *)((long)&(ctx->PlatformImeData).InputLineHeight + 1) ==
                *(char *)((long)&(ctx->PlatformImeDataPrev).InputLineHeight + 1));
      cVar25 = -(*(char *)((long)&(ctx->PlatformImeData).InputLineHeight + 2) ==
                *(char *)((long)&(ctx->PlatformImeDataPrev).InputLineHeight + 2));
      bVar26 = -(*(char *)((long)&(ctx->PlatformImeData).InputLineHeight + 3) ==
                *(char *)((long)&(ctx->PlatformImeDataPrev).InputLineHeight + 3));
      auVar3[1] = cVar12;
      auVar3[0] = cVar11;
      auVar3[2] = cVar13;
      auVar3[3] = cVar14;
      auVar3[4] = cVar15;
      auVar3[5] = cVar16;
      auVar3[6] = cVar17;
      auVar3[7] = cVar18;
      auVar3[8] = cVar19;
      auVar3[9] = cVar20;
      auVar3[10] = cVar21;
      auVar3[0xb] = cVar22;
      auVar3[0xc] = cVar23;
      auVar3[0xd] = cVar24;
      auVar3[0xe] = cVar25;
      auVar3[0xf] = bVar26;
      auVar4[1] = cVar12;
      auVar4[0] = cVar11;
      auVar4[2] = cVar13;
      auVar4[3] = cVar14;
      auVar4[4] = cVar15;
      auVar4[5] = cVar16;
      auVar4[6] = cVar17;
      auVar4[7] = cVar18;
      auVar4[8] = cVar19;
      auVar4[9] = cVar20;
      auVar4[10] = cVar21;
      auVar4[0xb] = cVar22;
      auVar4[0xc] = cVar23;
      auVar4[0xd] = cVar24;
      auVar4[0xe] = cVar25;
      auVar4[0xf] = bVar26;
      auVar8[1] = cVar14;
      auVar8[0] = cVar13;
      auVar8[2] = cVar15;
      auVar8[3] = cVar16;
      auVar8[4] = cVar17;
      auVar8[5] = cVar18;
      auVar8[6] = cVar19;
      auVar8[7] = cVar20;
      auVar8[8] = cVar21;
      auVar8[9] = cVar22;
      auVar8[10] = cVar23;
      auVar8[0xb] = cVar24;
      auVar8[0xc] = cVar25;
      auVar8[0xd] = bVar26;
      auVar7[1] = cVar15;
      auVar7[0] = cVar14;
      auVar7[2] = cVar16;
      auVar7[3] = cVar17;
      auVar7[4] = cVar18;
      auVar7[5] = cVar19;
      auVar7[6] = cVar20;
      auVar7[7] = cVar21;
      auVar7[8] = cVar22;
      auVar7[9] = cVar23;
      auVar7[10] = cVar24;
      auVar7[0xb] = cVar25;
      auVar7[0xc] = bVar26;
      auVar6[1] = cVar16;
      auVar6[0] = cVar15;
      auVar6[2] = cVar17;
      auVar6[3] = cVar18;
      auVar6[4] = cVar19;
      auVar6[5] = cVar20;
      auVar6[6] = cVar21;
      auVar6[7] = cVar22;
      auVar6[8] = cVar23;
      auVar6[9] = cVar24;
      auVar6[10] = cVar25;
      auVar6[0xb] = bVar26;
      auVar5[1] = cVar17;
      auVar5[0] = cVar16;
      auVar5[2] = cVar18;
      auVar5[3] = cVar19;
      auVar5[4] = cVar20;
      auVar5[5] = cVar21;
      auVar5[6] = cVar22;
      auVar5[7] = cVar23;
      auVar5[8] = cVar24;
      auVar5[9] = cVar25;
      auVar5[10] = bVar26;
      if ((ushort)((ushort)(SUB161(auVar3 >> 7,0) & 1) | (ushort)(SUB161(auVar4 >> 0xf,0) & 1) << 1
                   | (ushort)(SUB141(auVar8 >> 7,0) & 1) << 2 |
                   (ushort)(SUB131(auVar7 >> 7,0) & 1) << 3 |
                   (ushort)(SUB121(auVar6 >> 7,0) & 1) << 4 |
                   (ushort)(SUB111(auVar5 >> 7,0) & 1) << 5 |
                   (ushort)((byte)(CONCAT19(bVar26,CONCAT18(cVar25,CONCAT17(cVar24,CONCAT16(cVar23,
                                                  CONCAT15(cVar22,CONCAT14(cVar21,CONCAT13(cVar20,
                                                  CONCAT12(cVar19,CONCAT11(cVar18,cVar17))))))))) >>
                                  7) & 1) << 6 |
                   (ushort)((byte)(CONCAT18(bVar26,CONCAT17(cVar25,CONCAT16(cVar24,CONCAT15(cVar23,
                                                  CONCAT14(cVar22,CONCAT13(cVar21,CONCAT12(cVar20,
                                                  CONCAT11(cVar19,cVar18)))))))) >> 7) & 1) << 7 |
                  (ushort)(bVar26 >> 7) << 0xf) != 0xffff) {
        local_40 = FindViewportByID(ctx->PlatformImeViewport);
        p_Var2 = (ctx->IO).SetPlatformImeDataFn;
        if (local_40 == (ImGuiViewport *)0x0) {
          local_40 = GetMainViewport();
        }
        (*p_Var2)(local_40,&ctx->PlatformImeData);
      }
    }
    ctx->WithinFrameScopeWithImplicitWindow = false;
    if ((ctx->CurrentWindow != (ImGuiWindow *)0x0) &&
       ((ctx->CurrentWindow->WriteAccessed & 1U) == 0)) {
      ctx->CurrentWindow->Active = false;
    }
    End();
    NavEndFrame();
    DockContextEndFrame(ctx);
    SetCurrentViewport((ImGuiWindow *)0x0,(ImGuiViewportP *)0x0);
    if ((ctx->DragDropActive & 1U) != 0) {
      bVar1 = (ctx->DragDropPayload).Delivery;
      local_41 = 0;
      if ((ctx->DragDropPayload).DataFrameCount + 1 < ctx->FrameCount) {
        local_42 = 1;
        if ((ctx->DragDropSourceFlags & 0x20U) == 0) {
          bVar9 = IsMouseDown(ctx->DragDropMouseButton);
          local_42 = bVar9 ^ 0xff;
        }
        local_41 = local_42;
      }
      if (((bVar1 & 1U) != 0) || ((local_41 & 1) != 0)) {
        ClearDragDrop();
      }
    }
    if ((((ctx->DragDropActive & 1U) != 0) && (ctx->DragDropSourceFrameCount < ctx->FrameCount)) &&
       ((ctx->DragDropSourceFlags & 1U) == 0)) {
      ctx->DragDropWithinSource = true;
      SetTooltip("...");
      ctx->DragDropWithinSource = false;
    }
    ctx->WithinFrameScope = false;
    ctx->FrameCountEnded = ctx->FrameCount;
    UpdateMouseMovingWindowEndFrame();
    UpdateViewportsEndFrame();
    ImVector<ImGuiWindow_*>::resize(&ctx->WindowsTempSortBuffer,0);
    ImVector<ImGuiWindow_*>::reserve(&ctx->WindowsTempSortBuffer,(ctx->Windows).Size);
    for (window._0_4_ = 0; (int)window != (ctx->Windows).Size; window._0_4_ = (int)window + 1) {
      ppIVar10 = ImVector<ImGuiWindow_*>::operator[](&ctx->Windows,(int)window);
      window_00 = *ppIVar10;
      if (((window_00->Active & 1U) == 0) || ((window_00->Flags & 0x1000000U) == 0)) {
        AddWindowToSortBuffer(&ctx->WindowsTempSortBuffer,window_00);
      }
    }
    if ((ctx->Windows).Size != (ctx->WindowsTempSortBuffer).Size) {
      __assert_fail("g.Windows.Size == g.WindowsTempSortBuffer.Size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/imgui-src/imgui.cpp"
                    ,0x13f9,"void ImGui::EndFrame()");
    }
    ImVector<ImGuiWindow_*>::swap(&ctx->Windows,&ctx->WindowsTempSortBuffer);
    (ctx->IO).MetricsActiveWindows = ctx->WindowsActiveCount;
    ((ctx->IO).Fonts)->Locked = false;
    (ctx->IO).MouseWheelH =
         (float)(CONCAT13(extraout_XMM0_Bd,
                          CONCAT12(extraout_XMM0_Bc,CONCAT11(extraout_XMM0_Bb,extraout_XMM0_Ba))) ^
                CONCAT13(extraout_XMM0_Bd,
                         CONCAT12(extraout_XMM0_Bc,CONCAT11(extraout_XMM0_Bb,extraout_XMM0_Ba))));
    (ctx->IO).MouseWheel = 0.0;
    ImVector<unsigned_short>::resize(&(ctx->IO).InputQueueCharacters,0);
    memset((ctx->IO).NavInputs,0,0x50);
    CallContextHooks(ctx,ImGuiContextHookType_EndFramePost);
  }
  return;
}

Assistant:

void ImGui::EndFrame()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);

    // Don't process EndFrame() multiple times.
    if (g.FrameCountEnded == g.FrameCount)
        return;
    IM_ASSERT(g.WithinFrameScope && "Forgot to call ImGui::NewFrame()?");

    CallContextHooks(&g, ImGuiContextHookType_EndFramePre);

    ErrorCheckEndFrameSanityChecks();

    // Notify Platform/OS when our Input Method Editor cursor has moved (e.g. CJK inputs using Microsoft IME)
    if (g.IO.SetPlatformImeDataFn && memcmp(&g.PlatformImeData, &g.PlatformImeDataPrev, sizeof(ImGuiPlatformImeData)) != 0)
    {
        ImGuiViewport* viewport = FindViewportByID(g.PlatformImeViewport);
        g.IO.SetPlatformImeDataFn(viewport ? viewport : GetMainViewport(), &g.PlatformImeData);
    }

    // Hide implicit/fallback "Debug" window if it hasn't been used
    g.WithinFrameScopeWithImplicitWindow = false;
    if (g.CurrentWindow && !g.CurrentWindow->WriteAccessed)
        g.CurrentWindow->Active = false;
    End();

    // Update navigation: CTRL+Tab, wrap-around requests
    NavEndFrame();

    // Update docking
    DockContextEndFrame(&g);

    SetCurrentViewport(NULL, NULL);

    // Drag and Drop: Elapse payload (if delivered, or if source stops being submitted)
    if (g.DragDropActive)
    {
        bool is_delivered = g.DragDropPayload.Delivery;
        bool is_elapsed = (g.DragDropPayload.DataFrameCount + 1 < g.FrameCount) && ((g.DragDropSourceFlags & ImGuiDragDropFlags_SourceAutoExpirePayload) || !IsMouseDown(g.DragDropMouseButton));
        if (is_delivered || is_elapsed)
            ClearDragDrop();
    }

    // Drag and Drop: Fallback for source tooltip. This is not ideal but better than nothing.
    if (g.DragDropActive && g.DragDropSourceFrameCount < g.FrameCount && !(g.DragDropSourceFlags & ImGuiDragDropFlags_SourceNoPreviewTooltip))
    {
        g.DragDropWithinSource = true;
        SetTooltip("...");
        g.DragDropWithinSource = false;
    }

    // End frame
    g.WithinFrameScope = false;
    g.FrameCountEnded = g.FrameCount;

    // Initiate moving window + handle left-click and right-click focus
    UpdateMouseMovingWindowEndFrame();

    // Update user-facing viewport list (g.Viewports -> g.PlatformIO.Viewports after filtering out some)
    UpdateViewportsEndFrame();

    // Sort the window list so that all child windows are after their parent
    // We cannot do that on FocusWindow() because children may not exist yet
    g.WindowsTempSortBuffer.resize(0);
    g.WindowsTempSortBuffer.reserve(g.Windows.Size);
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        if (window->Active && (window->Flags & ImGuiWindowFlags_ChildWindow))       // if a child is active its parent will add it
            continue;
        AddWindowToSortBuffer(&g.WindowsTempSortBuffer, window);
    }

    // This usually assert if there is a mismatch between the ImGuiWindowFlags_ChildWindow / ParentWindow values and DC.ChildWindows[] in parents, aka we've done something wrong.
    IM_ASSERT(g.Windows.Size == g.WindowsTempSortBuffer.Size);
    g.Windows.swap(g.WindowsTempSortBuffer);
    g.IO.MetricsActiveWindows = g.WindowsActiveCount;

    // Unlock font atlas
    g.IO.Fonts->Locked = false;

    // Clear Input data for next frame
    g.IO.MouseWheel = g.IO.MouseWheelH = 0.0f;
    g.IO.InputQueueCharacters.resize(0);
    memset(g.IO.NavInputs, 0, sizeof(g.IO.NavInputs));

    CallContextHooks(&g, ImGuiContextHookType_EndFramePost);
}